

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

ostream * spvtools::opt::operator<<(ostream *str,Module *module)

{
  anon_class_8_1_ba1d7991 local_40;
  function<void_(const_spvtools::opt::Instruction_*)> local_38;
  Module *local_18;
  Module *module_local;
  ostream *str_local;
  
  local_40.str = str;
  local_18 = module;
  module_local = (Module *)str;
  std::function<void(spvtools::opt::Instruction_const*)>::operator<<
            ((function<void(spvtools::opt::Instruction_const*)> *)&local_38,&local_40);
  Module::ForEachInst(module,&local_38,false);
  std::function<void_(const_spvtools::opt::Instruction_*)>::~function(&local_38);
  return (ostream *)module_local;
}

Assistant:

std::ostream& operator<<(std::ostream& str, const Module& module) {
  module.ForEachInst([&str](const Instruction* inst) {
    str << *inst;
    if (inst->opcode() != spv::Op::OpFunctionEnd) {
      str << std::endl;
    }
  });
  return str;
}